

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseVarListOpt(WastParser *this,VarVector *out_var_list)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  Var local_e8;
  undefined1 local_a0 [8];
  Var var;
  
  var.field_2._24_8_ = 0;
  Var::Var((Var *)local_a0,0xffffffff,(Location *)((long)&var.field_2 + 0x18));
  while( true ) {
    var.field_2._24_8_ = 0;
    Var::Var(&local_e8,0xffffffff,(Location *)((long)&var.field_2 + 0x18));
    bVar3 = ParseVarOpt(this,(Var *)local_a0,&local_e8);
    Var::~Var(&local_e8);
    if (!bVar3) break;
    std::vector<wabt::Var,_std::allocator<wabt::Var>_>::push_back(out_var_list,(Var *)local_a0);
  }
  pVVar1 = (out_var_list->super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (out_var_list->super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  Var::~Var((Var *)local_a0);
  return pVVar1 != pVVar2;
}

Assistant:

bool WastParser::ParseVarListOpt(VarVector* out_var_list) {
  WABT_TRACE(ParseVarListOpt);
  Var var;
  while (ParseVarOpt(&var))
    out_var_list->push_back(var);

  return !out_var_list->empty();
}